

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeclarationBinderTester_3000_3999.cpp
# Opt level: O2

void __thiscall psy::C::DeclarationBinderTester::case3501(DeclarationBinderTester *this)

{
  Decl *pDVar1;
  Expectation *pEVar2;
  socklen_t __len;
  allocator_type *__a;
  initializer_list<int> __l;
  allocator_type local_36f;
  allocator<char> local_36e;
  allocator<char> local_36d;
  int local_36c;
  _Vector_base<int,_std::allocator<int>_> local_368;
  string local_350;
  string local_330 [32];
  Expectation local_310;
  Expectation local_258;
  Decl local_1a0;
  Decl local_d8;
  
  std::__cxx11::string::string<std::allocator<char>>(local_330,"void f() { int x ; }",&local_36d);
  Expectation::Expectation(&local_310);
  Decl::Decl(&local_1a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"x",&local_36e);
  pDVar1 = Decl::Object(&local_1a0,&local_350,VariableDeclaration,Block);
  pDVar1 = Ty::Basic(&pDVar1->ty_,Int_S,None);
  Decl::Decl(&local_d8,pDVar1);
  pEVar2 = Expectation::declaration(&local_310,&local_d8);
  local_36c = 0;
  __a = &local_36f;
  __l._M_len = 1;
  __l._M_array = &local_36c;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_368,__l,__a);
  __len = (socklen_t)__a;
  pEVar2 = Expectation::scopePath(pEVar2,(vector<int,_std::allocator<int>_> *)&local_368);
  Expectation::Expectation(&local_258,pEVar2);
  bind(this,(int)local_330,(sockaddr *)&local_258,__len);
  Expectation::~Expectation(&local_258);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_368);
  Decl::~Decl(&local_d8);
  std::__cxx11::string::~string((string *)&local_350);
  Decl::~Decl(&local_1a0);
  Expectation::~Expectation(&local_310);
  std::__cxx11::string::~string(local_330);
  return;
}

Assistant:

void DeclarationBinderTester::case3501()
{
    bind("void f() { int x ; }",
         Expectation()
            .declaration(Decl()
                     .Object("x", SymbolKind::VariableDeclaration, ScopeKind::Block)
                     .ty_.Basic(BasicTypeKind::Int_S))
            .scopePath({0}));
}